

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter_model.h
# Opt level: O2

Type __thiscall
mp::FlatModel<mp::DefaultFlatModelParams>::common_type<std::initializer_list<int>>
          (FlatModel<mp::DefaultFlatModelParams> *this,initializer_list<int> *va)

{
  double *pdVar1;
  int iVar2;
  iterator piVar3;
  size_type sVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  piVar3 = va->_M_array;
  sVar4 = va->_M_len;
  lVar5 = 0;
  do {
    if (sVar4 << 2 == lVar5) {
      return INTEGER;
    }
    iVar2 = *(int *)((long)piVar3 + lVar5);
    if ((this->var_type_).super__Vector_base<mp::var::Type,_std::allocator<mp::var::Type>_>._M_impl.
        super__Vector_impl_data._M_start[iVar2] != INTEGER) {
      dVar7 = (this->var_lb_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar2];
      pdVar1 = (this->var_ub_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + iVar2;
      if (dVar7 != *pdVar1) {
        return CONTINUOUS;
      }
      if (NAN(dVar7) || NAN(*pdVar1)) {
        return CONTINUOUS;
      }
      dVar6 = floor(dVar7);
      dVar7 = ceil(dVar7);
      if (dVar6 != dVar7) {
        return CONTINUOUS;
      }
      if (NAN(dVar6) || NAN(dVar7)) {
        return CONTINUOUS;
      }
    }
    lVar5 = lVar5 + 4;
  } while( true );
}

Assistant:

var::Type common_type(const VarArray& va) const {
    auto type = var::Type::INTEGER;
    for (auto v: va) {
      if (!is_integer_var(v) &&
          (!is_fixed(v) || !is_integer_value(fixed_value(v)))) {
        type = var::Type::CONTINUOUS;
        break;
      }
    }
    return type;
  }